

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O1

wchar_t * ON_wString::ToNumber(wchar_t *buffer,ON__UINT64 value_on_failure,ON__UINT64 *value)

{
  ulong uVar1;
  wchar_t c;
  bool bAcceptOrdinarySign;
  bool bAcceptSuperscriptSign;
  bool bAcceptSubscriptSign;
  int iVar2;
  int iVar3;
  uint uVar4;
  wchar_t *pwVar5;
  ON__UINT64 r;
  ulong uVar6;
  wchar_t *s;
  wchar_t *pwVar7;
  bool bVar8;
  ON__UINT64 local_40;
  
  if (value == (ON__UINT64 *)0x0) {
    return (wchar_t *)0x0;
  }
  local_40 = value_on_failure;
  if (buffer != (wchar_t *)0x0) {
    c = *buffer;
    iVar2 = PlusOrMinusSignFromWideChar(c,true,true,true);
    pwVar7 = buffer + (0 < iVar2);
    bAcceptSuperscriptSign = false;
    bAcceptOrdinarySign = IsDecimalDigit(*pwVar7,true,false,false);
    if (!bAcceptOrdinarySign) {
      bAcceptSuperscriptSign = IsDecimalDigit(*pwVar7,false,true,false);
    }
    if ((bAcceptOrdinarySign | bAcceptSuperscriptSign) == 0) {
      bAcceptSubscriptSign = IsDecimalDigit(*pwVar7,false,false,true);
    }
    else {
      bAcceptSubscriptSign = false;
    }
    if (((byte)(bAcceptOrdinarySign | bAcceptSuperscriptSign | bAcceptSubscriptSign) == 1) &&
       (iVar3 = PlusOrMinusSignFromWideChar
                          (c,bAcceptOrdinarySign,bAcceptSuperscriptSign,bAcceptSubscriptSign),
       iVar2 == iVar3)) {
      pwVar5 = (wchar_t *)0x0;
      uVar6 = 0;
      do {
        uVar4 = DecimalDigitFromWideChar
                          (*pwVar7,bAcceptOrdinarySign,bAcceptSuperscriptSign,bAcceptSubscriptSign,
                           10);
        if (uVar4 < 10) {
          uVar1 = (ulong)uVar4 + uVar6 * 10;
          bVar8 = uVar6 <= uVar1;
          if (uVar6 < uVar1) {
            uVar6 = uVar1;
          }
        }
        else {
          bVar8 = false;
          pwVar5 = pwVar7;
          local_40 = uVar6;
        }
        pwVar7 = pwVar7 + 1;
      } while (bVar8);
      goto LAB_005c976b;
    }
  }
  pwVar5 = (wchar_t *)0x0;
LAB_005c976b:
  *value = local_40;
  return pwVar5;
}

Assistant:

const wchar_t* ON_wString::ToNumber(
  const wchar_t* buffer,
  ON__UINT64 value_on_failure,
  ON__UINT64* value
  )
{
  if (nullptr == value)
    return nullptr;

  ON__UINT64 u = value_on_failure;
  const wchar_t* rc = nullptr;

  if (nullptr != buffer)
  {
    const wchar_t c0 = buffer[0];
    const int sign = ON_wString::PlusOrMinusSignFromWideChar(c0,true,true,true);
    if (sign > 0)
      ++buffer; // c0 is some type of plus sign.

    const bool b0 = ON_wString::IsDecimalDigit(buffer[0], true, false, false);
    const bool b1 = false == b0 && ON_wString::IsDecimalDigit(buffer[0], false, true, false);
    const bool b2 = false == b0 && false == b1 && ON_wString::IsDecimalDigit(buffer[0], false, false, true);

    if ((b0 || b1 || b2) && sign == ON_wString::PlusOrMinusSignFromWideChar(c0, b0, b1, b2))
    {
      ON__UINT64 r = 0;
      for (const wchar_t* s = buffer;/*empty test*/; s++)
      {
        const ON__UINT64 d = (ON__UINT64)ON_wString::DecimalDigitFromWideChar(*s, b0, b1, b2, 10);
        if (d < 10LLU)
        {
          const ON__UINT64 r1 = r * 10LLU + d;
          if (r1 < r)
          {
            // overflow
            break;
          }
          r = r1;
          continue;
        }
        u = r;
        rc = s;
        break;
      }
    }
  }

  *value = u;
  return rc;
}